

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O2

const_ret_type __thiscall
dlib::
op_add_scalar<dlib::matrix_op<dlib::op_sumc<dlib::matrix_op<dlib::op_squared<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>_>
::apply(op_add_scalar<dlib::matrix_op<dlib::op_sumc<dlib::matrix_op<dlib::op_squared<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>_>
        *this,long r,long c)

{
  const_ret_type cVar1;
  
  cVar1 = op_sumc<dlib::matrix_op<dlib::op_squared<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
          ::apply(&((this->
                    super_basic_op_m<dlib::matrix_op<dlib::op_sumc<dlib::matrix_op<dlib::op_squared<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>_>
                    ).m)->op,r,c);
  return cVar1 + this->s;
}

Assistant:

const_ret_type apply (long r, long c) const
        { 
            return this->m(r,c) + s;
        }